

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

Option * __thiscall CLI::App::operator[](App *this,char *option_name)

{
  Option *pOVar1;
  allocator local_31;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,option_name,&local_31);
  pOVar1 = get_option(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return pOVar1;
}

Assistant:

const Option *operator[](const char *option_name) const { return get_option(option_name); }